

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O1

bool __thiscall
ON_SubDMeshProxyUserData::Write(ON_SubDMeshProxyUserData *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    iVar3 = (*(this->super_ON_UserData).super_ON_Object._vptr_ON_Object[6])(this,0);
    bVar1 = ON_BinaryArchive::WriteBool(archive,SUB41(iVar3,0));
    if ((SUB41(iVar3,0) & bVar1) == 1) {
      iVar3 = (*(this->m_subd->super_ON_Geometry).super_ON_Object._vptr_ON_Object[10])
                        (this->m_subd,archive);
      if (((((char)iVar3 == '\0') ||
           (bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_mesh_face_count), !bVar1)) ||
          (bVar1 = ON_BinaryArchive::WriteInt(archive,this->m_mesh_vertex_count), !bVar1)) ||
         (bVar1 = ON_SHA1_Hash::Write(&this->m_mesh_face_array_sha1,archive), !bVar1)) {
        bVar1 = false;
      }
      else {
        bVar1 = ON_SHA1_Hash::Write(&this->m_mesh_vertex_array_sha1,archive);
      }
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_SubDMeshProxyUserData::Write(ON_BinaryArchive& archive) const
{
  const int chunk_version = 1;
  if ( false == archive.BeginWrite3dmAnonymousChunk(chunk_version) )
    return false;

  bool rc = false;

  for (;;)
  {
    const bool bIsValid = IsValid();
    if (!archive.WriteBool(bIsValid))
      break;

    if (false == bIsValid)
    {
      rc = true;
      break;
    }

    if (!m_subd->Write(archive))
      break;
    if (!archive.WriteInt(m_mesh_face_count))
      break;
    if (!archive.WriteInt(m_mesh_vertex_count))
      break;
    if (!m_mesh_face_array_sha1.Write(archive))
      break;
    if (!m_mesh_vertex_array_sha1.Write(archive))
      break;

    rc = true;
    break;
  }

  if (!archive.EndWrite3dmChunk())
    rc = false;

  return rc;
}